

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
* pstore::index::details::internal_node::get_node
            (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
             *__return_storage_ptr__,database *db,index_pointer node)

{
  database *db_00;
  bool bVar1;
  element_type *local_50;
  internal_node *p;
  undefined1 local_40 [8];
  shared_ptr<const_pstore::index::details::internal_node> store_internal;
  void *local_28;
  database *local_20;
  database *db_local;
  index_pointer node_local;
  
  local_20 = db;
  db_local = (database *)node;
  node_local = (index_pointer)__return_storage_ptr__;
  bVar1 = index_pointer::is_heap((index_pointer *)&db_local);
  db_00 = local_20;
  if (bVar1) {
    local_28 = (void *)0x0;
    store_internal.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         index_pointer::untag<pstore::index::details::internal_node*,void>
                   ((index_pointer *)&db_local);
    std::
    pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
    ::pair<std::nullptr_t,_pstore::index::details::internal_node_*,_true>
              (__return_storage_ptr__,&local_28,
               (internal_node **)
               &store_internal.
                super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    p = (internal_node *)
        index_pointer::untag_address<pstore::index::details::internal_node,void>
                  ((index_pointer *)&db_local);
    read_node((internal_node *)local_40,db_00,
              (typed_address<pstore::index::details::internal_node>)p);
    local_50 = std::
               __shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
               ::get((__shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      *)local_40);
    std::
    pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
    ::pair<std::shared_ptr<const_pstore::index::details::internal_node>,_true>
              (__return_storage_ptr__,
               (shared_ptr<const_pstore::index::details::internal_node> *)local_40,&local_50);
    std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
              ((shared_ptr<const_pstore::index::details::internal_node> *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

auto internal_node::get_node (database const & db, index_pointer const node)
                -> std::pair<std::shared_ptr<internal_node const>, internal_node const *> {

                if (node.is_heap ()) {
                    return {nullptr, node.untag<internal_node *> ()};
                }

                std::shared_ptr<internal_node const> store_internal =
                    internal_node::read_node (db, node.untag_address<internal_node> ());
                auto const * const p = store_internal.get ();
                return {std::move (store_internal), p};
            }